

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.cpp
# Opt level: O3

Formula * __thiscall
FMB::FiniteModelMultiSorted::partialEvaluate(FiniteModelMultiSorted *this,Formula *formula)

{
  Literal *lit;
  Connective CVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  Formula *pFVar5;
  Formula *pFVar6;
  Formula *pFVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  long *plVar10;
  uint uVar11;
  Literal *pLVar12;
  long *plVar13;
  undefined8 *puVar14;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar7 = formula;
  switch(formula->_connective) {
  case LITERAL:
    lit = *(Literal **)(formula + 1);
    iVar4 = 0;
    pLVar12 = lit;
    if (*(int *)&(lit->super_Term).field_0xc < 0) {
      iVar4 = 0;
      do {
        pLVar12 = *(Literal **)&(pLVar12->super_Term).field_9._vars;
        if (((ulong)pLVar12 & 1) != 0) {
          uVar11 = 3;
          goto LAB_002a5f6a;
        }
        iVar4 = iVar4 + 2;
      } while (*(int *)&(pLVar12->super_Term).field_0xc < 0);
    }
    uVar11 = (pLVar12->super_Term).field_9._vars;
LAB_002a5f6a:
    if (iVar4 + uVar11 == 0) {
      bVar3 = evaluateGroundLiteral(this,lit);
      if (bVar3) {
        pFVar7 = Kernel::Formula::trueFormula();
        return pFVar7;
      }
      pFVar7 = Kernel::Formula::falseFormula();
      return pFVar7;
    }
    break;
  case AND:
  case OR:
    puVar9 = *(undefined8 **)(formula + 1);
    if (puVar9 == (undefined8 *)0x0) {
      puVar8 = (undefined8 *)0x0;
    }
    else {
      puVar14 = (undefined8 *)0x0;
      do {
        pFVar7 = (Formula *)*puVar9;
        puVar9 = (undefined8 *)puVar9[1];
        pFVar7 = partialEvaluate(this,pFVar7);
        puVar8 = (undefined8 *)
                 Lib::FixedSizeAllocator<16UL>::alloc
                           ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18))
        ;
        *puVar8 = pFVar7;
        puVar8[1] = puVar14;
        puVar14 = puVar8;
      } while (puVar9 != (undefined8 *)0x0);
    }
    pFVar7 = (Formula *)
             Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pFVar7->_connective = formula->_connective;
    (pFVar7->_label)._M_dataplus._M_p = (pointer)&(pFVar7->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar7->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(undefined8 **)(pFVar7 + 1) = puVar8;
    break;
  case IMP:
  case IFF:
  case XOR:
    pFVar7 = (Formula *)formula[1]._label._M_dataplus._M_p;
    pFVar6 = partialEvaluate(this,*(Formula **)(formula + 1));
    pFVar5 = partialEvaluate(this,pFVar7);
    pFVar7 = (Formula *)
             Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar7->_connective = formula->_connective;
    (pFVar7->_label)._M_dataplus._M_p = (pointer)&(pFVar7->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar7->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Formula **)(pFVar7 + 1) = pFVar6;
    pFVar7[1]._label._M_dataplus._M_p = (pointer)pFVar5;
    break;
  case NOT:
    pFVar6 = partialEvaluate(this,*(Formula **)(formula + 1));
    pFVar7 = (Formula *)
             Lib::FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
    pFVar7->_connective = NOT;
    (pFVar7->_label)._M_dataplus._M_p = (pointer)&(pFVar7->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar7->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    *(Formula **)(pFVar7 + 1) = pFVar6;
    break;
  case FORALL:
  case EXISTS:
    CVar1 = formula[1]._connective;
    uVar2 = *(undefined4 *)&formula[1].field_0x4;
    pFVar6 = partialEvaluate(this,(Formula *)formula[1]._label._M_string_length);
    pFVar7 = (Formula *)
             Lib::FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
    pFVar7->_connective = formula->_connective;
    (pFVar7->_label)._M_dataplus._M_p = (pointer)&(pFVar7->_label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pFVar7->_label,Kernel::Formula::DEFAULT_LABEL_abi_cxx11_,
               DAT_00b50330 + Kernel::Formula::DEFAULT_LABEL_abi_cxx11_);
    pFVar7[1]._connective = CVar1;
    *(undefined4 *)&pFVar7[1].field_0x4 = uVar2;
    pFVar7[1]._label._M_dataplus._M_p = (pointer)0x0;
    pFVar7[1]._label._M_string_length = (size_type)pFVar6;
    break;
  default:
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x50);
    Kernel::Formula::toString_abi_cxx11_(&local_90,formula);
    std::operator+(&local_50,"Cannot evaluate ",&local_90);
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_70 = (long *)*plVar10;
    plVar13 = plVar10 + 2;
    if (local_70 == plVar13) {
      local_60 = *plVar13;
      uStack_58 = (undefined4)plVar10[3];
      uStack_54 = *(undefined4 *)((long)plVar10 + 0x1c);
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar13;
    }
    local_68 = plVar10[1];
    *plVar10 = (long)plVar13;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    *puVar9 = &PTR_cry_00b3dfc0;
    puVar9[1] = puVar9 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar9 + 1),local_70,local_68 + (long)local_70);
    *puVar9 = &PTR_cry_00b3e0a8;
    *(undefined4 *)(puVar9 + 5) = 0;
    puVar9[6] = puVar9 + 8;
    puVar9[7] = 0;
    *(undefined1 *)(puVar9 + 8) = 0;
    __cxa_throw(puVar9,&Lib::UserErrorException::typeinfo,
                Lib::UserErrorException::~UserErrorException);
  case FALSE:
  case TRUE:
    break;
  }
  return pFVar7;
}

Assistant:

Formula* FiniteModelMultiSorted::partialEvaluate(Formula* formula)
    {
#if DEBUG_MODEL
        for(unsigned i=0;i<depth;i++){ cout << "."; }
        cout << "Evaluating..." << formula->toString() << endl;
#endif
        
        switch(formula->connective()){
                case LITERAL:
            {
                Literal* lit = formula->literal();
                if(!lit->ground()){
                    return formula;
                }
                bool evaluated = evaluateGroundLiteral(lit);
                return evaluated ? Formula::trueFormula() : Formula::falseFormula(); 
            }
                
                case FALSE:
                case TRUE:
                    return formula;
                case NOT:
                {
                  Formula* inner = partialEvaluate(formula->uarg());
                  return new NegatedFormula(inner);
                }
                case AND:
                case OR:
            {
                FormulaList* args = formula->args();
                FormulaList* newArgs = 0;
                FormulaList::Iterator fit(args);
                while(fit.hasNext()){
                    Formula* newArg = partialEvaluate(fit.next());
                    FormulaList::push(newArg,newArgs);
                }
                return new JunctionFormula(formula->connective(),newArgs); 
            }
                
                case IMP:
                case XOR:
                case IFF:
            {
                Formula* left = formula->left();
                Formula* right = formula->right();
                Formula* newLeft = partialEvaluate(left);
                Formula* newRight = partialEvaluate(right);
                
                return new BinaryFormula(formula->connective(),newLeft,newRight); 
            }
                
                case FORALL:
                case EXISTS:
            {
                VList* vs = formula->vars();
                Formula* inner  = formula->qarg();
                Formula* newInner = partialEvaluate(inner);
                return new QuantifiedFormula(formula->connective(),vs,0,newInner);
            }
            default:
                USER_ERROR("Cannot evaluate " + formula->toString() + ", not supported");
        }

        NOT_IMPLEMENTED;
        return 0;
    }